

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::MergeFrom(UninterpretedOption *this,Message *from)

{
  UninterpretedOption *pUVar1;
  UninterpretedOption *in_RDI;
  UninterpretedOption *unaff_retaddr;
  UninterpretedOption *source;
  Message *in_stack_000003c8;
  Message *in_stack_000003d0;
  
  pUVar1 = DynamicCastToGenerated<google::protobuf::UninterpretedOption>(&in_RDI->super_Message);
  if (pUVar1 == (UninterpretedOption *)0x0) {
    internal::ReflectionOps::Merge(in_stack_000003d0,in_stack_000003c8);
  }
  else {
    MergeFrom(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void UninterpretedOption::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.UninterpretedOption)
  GOOGLE_DCHECK_NE(&from, this);
  const UninterpretedOption* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<UninterpretedOption>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.UninterpretedOption)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.UninterpretedOption)
    MergeFrom(*source);
  }
}